

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

void __thiscall i2p::sam::Session::CheckControlSock(Session *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint uVar4;
  pointer pSVar5;
  char *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock12;
  string errmsg;
  Level in_stack_00000100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000110;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  char *in_stack_ffffffffffffff88;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff98;
  LogFlags in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RDI,
             CONCAT13(in_stack_ffffffffffffff7f,
                      CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)),
             SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (bVar1) {
    pSVar5 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                       ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    uVar4 = (*pSVar5->_vptr_Sock[0x13])(pSVar5,local_28);
    uVar2 = (undefined1)uVar4;
    if ((uVar4 & 1) == 0) {
      uVar3 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                  Trace);
      if ((bool)uVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff7c,
                                                          in_stack_ffffffffffffff78))),
                   (char *)in_stack_ffffffffffffff70);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff7c,
                                                          in_stack_ffffffffffffff78))),
                   (char *)in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff88 = "Control socket error: %s\n";
        in_stack_ffffffffffffff58 = 1;
        LogPrintFormatInternal<std::__cxx11::string>
                  (in_stack_00000020,(string_view)in_stack_00000010,in_stack_ffffffffffffffcc,
                   in_stack_ffffffffffffffc0,in_stack_00000100,in_stack_00000008,in_stack_00000110);
      }
      Disconnect((Session *)in_stack_ffffffffffffff88);
    }
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Session::CheckControlSock()
{
    LOCK(m_mutex);

    std::string errmsg;
    if (m_control_sock && !m_control_sock->IsConnected(errmsg)) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Control socket error: %s\n", errmsg);
        Disconnect();
    }
}